

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdFindInstruction(INSTRUX *Instrux,ND_UINT8 *Code,ND_SIZET Size,ND_IDBE **InsDef)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint local_70;
  uint local_6c;
  uint local_48;
  ND_UINT32 nextOpcode;
  ND_BOOL redf3;
  ND_BOOL redf2;
  ND_BOOL stop;
  ND_IDBE *pIns;
  ND_TABLE *pTable;
  NDSTATUS status;
  ND_IDBE **InsDef_local;
  ND_SIZET Size_local;
  ND_UINT8 *Code_local;
  INSTRUX *Instrux_local;
  
  pTable._4_4_ = 0;
  _nextOpcode = (ND_IDBE *)0x0;
  bVar8 = false;
  local_48 = 0;
  bVar10 = false;
  bVar9 = false;
  switch(*(ushort *)&Instrux->field_0x2 & 0xf) {
  case 0:
    if (*(char *)((long)&Instrux->field_73 + 1) < '\0') {
      pIns = (ND_IDBE *)&gLegacyMap_opcode_0f_opcode;
    }
    else {
      pIns = (ND_IDBE *)&gLegacyMap_opcode;
    }
    break;
  case 1:
    pIns = (ND_IDBE *)gXopMap_mmmmm.Table[(uint)Instrux->Exs >> 9 & 0x1f];
    break;
  case 2:
    pIns = (ND_IDBE *)gVexMap_mmmmm.Table[(uint)Instrux->Exs >> 9 & 0x1f];
    break;
  case 3:
    pIns = (ND_IDBE *)gEvexMap_mmmmm.Table[(uint)Instrux->Exs >> 9 & 0x1f];
    break;
  default:
    pIns = (ND_IDBE *)0x0;
  }
  while (!bVar8 && pIns != (ND_IDBE *)0x0) {
    uVar1._0_2_ = pIns->Instruction;
    uVar1._2_1_ = pIns->Category;
    uVar1._3_1_ = pIns->IsaSet;
    switch(uVar1) {
    case 0:
      _nextOpcode = *(ND_IDBE **)&pIns->ValidModes;
      bVar8 = true;
      break;
    case 1:
      pTable._4_4_ = NdFetchOpcode(Instrux,Code,Instrux->Length,Size);
      if (pTable._4_4_ < 0x80000000) {
        pIns = (ND_IDBE *)pIns->Operands[(ulong)Instrux->OpCodeBytes[local_48] - 6];
        local_48 = local_48 + 1;
      }
      else {
        bVar8 = true;
      }
      break;
    case 2:
      if (((*(uint *)&Instrux->field_0x5 >> 0xb & 1) == 0) &&
         (pTable._4_4_ = NdFetchModrmSibDisplacement(Instrux,Code,Instrux->Length,Size),
         0x7fffffff < pTable._4_4_)) {
        bVar8 = true;
      }
      else {
        pTable._4_4_ = NdFetchOpcode(Instrux,Code,Instrux->Length,Size);
        if (pTable._4_4_ < 0x80000000) {
          pIns = (ND_IDBE *)pIns->Operands[(ulong)Instrux->OpCodeBytes[local_48] - 6];
          local_48 = local_48 + 1;
        }
        else {
          bVar8 = true;
        }
      }
      break;
    case 3:
      if (((*(uint *)&Instrux->field_0x5 >> 0xb & 1) == 0) &&
         (pTable._4_4_ = NdFetchModrmSibDisplacement(Instrux,Code,Instrux->Length,Size),
         0x7fffffff < pTable._4_4_)) {
        bVar8 = true;
      }
      else {
        pIns = (ND_IDBE *)pIns->Operands[(ulong)((Instrux->ModRm).ModRm >> 3 & 7) - 6];
      }
      break;
    case 4:
      if (((*(uint *)&Instrux->field_0x5 >> 0xb & 1) == 0) &&
         (pTable._4_4_ = NdFetchModrmSibDisplacement(Instrux,Code,Instrux->Length,Size),
         0x7fffffff < pTable._4_4_)) {
        bVar8 = true;
      }
      else {
        pIns = (ND_IDBE *)pIns->Operands[(long)(int)(uint)((Instrux->ModRm).ModRm >> 6 == 3) + -6];
      }
      break;
    case 5:
      if (((*(uint *)&Instrux->field_0x5 >> 0xb & 1) == 0) &&
         (pTable._4_4_ = NdFetchModrmSibDisplacement(Instrux,Code,Instrux->Length,Size),
         0x7fffffff < pTable._4_4_)) {
        bVar8 = true;
      }
      else {
        pIns = (ND_IDBE *)pIns->Operands[(ulong)((Instrux->ModRm).ModRm & 7) - 6];
      }
      break;
    case 6:
      if ((Instrux->Rep != 0xf2) || (bVar9)) {
        if ((Instrux->Rep != 0xf3) || (bVar10)) {
          if ((*(uint *)&Instrux->field_0x5 >> 5 & 1) == 0) {
            pIns = *(ND_IDBE **)&pIns->ValidModes;
          }
          else {
            pIns = *(ND_IDBE **)&pIns->FpuFlags;
            *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 & 0x7fffffff | 0x80000000;
          }
        }
        else {
          bVar10 = true;
          pIns = *(ND_IDBE **)&pIns->ModifiedFlags;
          *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 & 0xfffd | 2;
        }
      }
      else {
        bVar9 = true;
        pIns = *(ND_IDBE **)&pIns->ClearedFlags;
        *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 & 0xfffe | 1;
      }
      break;
    case 7:
      if (pIns->Operands[(long)(int)((*(uint *)Instrux & 3) + 1) + -6] == 0) {
        pIns = *(ND_IDBE **)&pIns->ValidModes;
      }
      else {
        pIns = (ND_IDBE *)pIns->Operands[(long)(int)((*(uint *)Instrux & 3) + 1) + -6];
      }
      break;
    case 8:
      if (((undefined1  [488])*Instrux & (undefined1  [488])0x3) == (undefined1  [488])0x2) {
        if ((pIns->Attributes == 0) ||
           (((*(uint *)&Instrux->field_0x5 >> 5 & 1) != 0 && (((uint)Instrux->Exs & 1) == 0)))) {
          if (pIns->CpuidFlag == 0) {
            if (pIns->Operands[(long)(int)((*(uint *)Instrux >> 8 & 3) + 1) + -6] == 0) {
              pIns = *(ND_IDBE **)&pIns->ValidModes;
            }
            else {
              pIns = (ND_IDBE *)pIns->Operands[(long)(int)((*(uint *)Instrux >> 8 & 3) + 1) + -6];
            }
          }
          else {
            pIns = (ND_IDBE *)pIns->CpuidFlag;
          }
        }
        else {
          pIns = (ND_IDBE *)pIns->Attributes;
        }
      }
      else if (pIns->Operands[(long)(int)((*(uint *)Instrux >> 8 & 3) + 1) + -6] == 0) {
        pIns = *(ND_IDBE **)&pIns->ValidModes;
      }
      else {
        pIns = (ND_IDBE *)pIns->Operands[(long)(int)((*(uint *)Instrux >> 8 & 3) + 1) + -6];
      }
      break;
    case 9:
      if (pIns->Operands[(long)(int)((*(uint *)Instrux >> 6 & 3) + 1) + -6] == 0) {
        pIns = *(ND_IDBE **)&pIns->ValidModes;
      }
      else {
        pIns = (ND_IDBE *)pIns->Operands[(long)(int)((*(uint *)Instrux >> 6 & 3) + 1) + -6];
      }
      break;
    case 10:
      if (((((uint)Instrux->Exs >> 3 & 1) == 0) && (((uint)Instrux->Exs >> 6 & 1) == 0)) ||
         (lVar2._0_1_ = pIns->FpuFlags, lVar2._1_1_ = pIns->EvexMode, lVar2._2_1_ = pIns->SimdExc,
         lVar2._3_1_ = pIns->field_0x13, lVar2._4_4_ = pIns->TestedFlags, lVar2 == 0)) {
        if ((((uint)Instrux->Exs & 1) == 0) ||
           (lVar3._0_4_ = pIns->ModifiedFlags, lVar3._4_4_ = pIns->SetFlags, lVar3 == 0)) {
          if ((((undefined1  [488])*Instrux & (undefined1  [488])0x3) == (undefined1  [488])0x2) &&
             (*(long *)&pIns->ClearedFlags != 0)) {
            pIns = *(ND_IDBE **)&pIns->ClearedFlags;
          }
          else if ((Instrux->Rep == 0xf3) && (pIns->Attributes != 0)) {
            pIns = (ND_IDBE *)pIns->Attributes;
          }
          else if ((Instrux->Rep == '\0') || (pIns->CpuidFlag == 0)) {
            if ((((((undefined1  [488])*Instrux & (undefined1  [488])0x3) == (undefined1  [488])0x2)
                 && ((*(uint *)&Instrux->field_0x5 >> 0xb & 1) != 0)) &&
                ((Instrux->ModRm).ModRm >> 6 == 0)) &&
               ((((Instrux->ModRm).ModRm & 7) == 5 && (pIns->Operands[0] != 0)))) {
              pIns = (ND_IDBE *)pIns->Operands[0];
            }
            else if (((*(uint *)&Instrux->field_0x5 >> 1 & 1) == 0) || (pIns->Operands[1] == 0)) {
              if ((((*(uint *)&Instrux->field_0x5 >> 1 & 1) == 0) ||
                  ((*(byte *)((long)&Instrux->field_73 + 1) >> 3 & 1) == 0)) ||
                 (pIns->Operands[2] == 0)) {
                pIns = *(ND_IDBE **)&pIns->ValidModes;
              }
              else {
                pIns = (ND_IDBE *)pIns->Operands[2];
              }
            }
            else {
              pIns = (ND_IDBE *)pIns->Operands[1];
            }
          }
          else {
            pIns = (ND_IDBE *)pIns->CpuidFlag;
          }
        }
        else {
          pIns = *(ND_IDBE **)&pIns->ModifiedFlags;
        }
      }
      else {
        pIns = *(ND_IDBE **)&pIns->FpuFlags;
      }
      break;
    case 0xb:
      if (pIns->Operands[(ulong)(*(uint *)Instrux >> 0x1c) - 6] == 0) {
        pIns = *(ND_IDBE **)&pIns->ValidModes;
      }
      else {
        pIns = (ND_IDBE *)pIns->Operands[(ulong)(*(uint *)Instrux >> 0x1c) - 6];
      }
      break;
    case 0xc:
      lVar4._0_1_ = pIns->FpuFlags;
      lVar4._1_1_ = pIns->EvexMode;
      lVar4._2_1_ = pIns->SimdExc;
      lVar4._3_1_ = pIns->field_0x13;
      lVar4._4_4_ = pIns->TestedFlags;
      if ((lVar4 == 0) || ((Instrux->FeatMode & 1) == 0)) {
        lVar5._0_4_ = pIns->ModifiedFlags;
        lVar5._4_4_ = pIns->SetFlags;
        if ((lVar5 == 0) || ((Instrux->FeatMode & 2) == 0)) {
          if ((*(long *)&pIns->ClearedFlags == 0) || ((Instrux->FeatMode & 4) == 0)) {
            if ((pIns->Attributes == 0) || ((Instrux->FeatMode & 8) == 0)) {
              pIns = *(ND_IDBE **)&pIns->ValidModes;
            }
            else {
              pIns = (ND_IDBE *)pIns->Attributes;
            }
          }
          else {
            pIns = *(ND_IDBE **)&pIns->ClearedFlags;
          }
        }
        else {
          pIns = *(ND_IDBE **)&pIns->ModifiedFlags;
        }
      }
      else {
        pIns = *(ND_IDBE **)&pIns->FpuFlags;
      }
      break;
    case 0xd:
      pIns = (ND_IDBE *)pIns->Operands[(ulong)((uint)Instrux->Exs >> 9 & 0x1f) - 6];
      break;
    case 0xe:
      pIns = (ND_IDBE *)pIns->Operands[(ulong)((uint)Instrux->Exs >> 7 & 3) - 6];
      break;
    case 0xf:
      if ((((*(uint *)&Instrux->field_0x5 >> 4 & 1) == 0) || (((uint)Instrux->Exs >> 9 & 0x1f) == 4)
          ) || (((uint)Instrux->Exs >> 0x15 & 1) == 0)) {
        pIns = (ND_IDBE *)pIns->Operands[(ulong)((uint)Instrux->Exs >> 0xe & 3) - 6];
      }
      else if (((*(uint *)&Instrux->field_0x5 >> 0xb & 1) == 0) &&
              (pTable._4_4_ = NdFetchModrmSibDisplacement(Instrux,Code,Instrux->Length,Size),
              0x7fffffff < pTable._4_4_)) {
        bVar8 = true;
      }
      else if ((Instrux->ModRm).ModRm >> 6 == 3) {
        lVar6._0_4_ = pIns->ModifiedFlags;
        lVar6._4_4_ = pIns->SetFlags;
        if (lVar6 == 0) {
          lVar7._0_1_ = pIns->FpuFlags;
          lVar7._1_1_ = pIns->EvexMode;
          lVar7._2_1_ = pIns->SimdExc;
          lVar7._3_1_ = pIns->field_0x13;
          lVar7._4_4_ = pIns->TestedFlags;
          if (lVar7 == 0) {
            pIns = *(ND_IDBE **)&pIns->ValidModes;
          }
          else {
            pIns = *(ND_IDBE **)&pIns->FpuFlags;
          }
        }
        else {
          pIns = *(ND_IDBE **)&pIns->ModifiedFlags;
        }
      }
      else {
        pIns = (ND_IDBE *)pIns->Operands[(ulong)((uint)Instrux->Exs >> 0xe & 3) - 6];
      }
      break;
    case 0x10:
      pIns = (ND_IDBE *)pIns->Operands[(ulong)((uint)Instrux->Exs & 1) - 6];
      break;
    case 0x11:
      if (((undefined1  [488])*Instrux & (undefined1  [488])0x3) == (undefined1  [488])0x2) {
        local_6c = (uint)Instrux->Exs & 1;
      }
      else {
        local_6c = 0;
      }
      pIns = (ND_IDBE *)pIns->Operands[(long)(int)local_6c + -6];
      break;
    case 0x12:
      pIns = (ND_IDBE *)pIns->Operands[(ulong)((uint)Instrux->Exs >> 0x1a & 1) - 6];
      break;
    case 0x13:
      pIns = (ND_IDBE *)pIns->Operands[(ulong)((uint)Instrux->Exs >> 0x1b & 1) - 6];
      break;
    case 0x14:
      pIns = (ND_IDBE *)pIns->Operands[(ulong)((uint)Instrux->Exs >> 0x1c) - 6];
      break;
    default:
      pTable._4_4_ = 0x80000200;
      bVar8 = true;
    }
  }
  if (pTable._4_4_ < 0x80000000) {
    if (_nextOpcode == (ND_IDBE *)0x0) {
      pTable._4_4_ = 0x80000002;
    }
    else {
      if (((_nextOpcode->Attributes & 1) != 0) && ((*(uint *)&Instrux->field_0x5 >> 0xb & 1) == 0))
      {
        if ((_nextOpcode->Attributes & 0x20000) == 0) {
          pTable._4_4_ = NdFetchModrmSibDisplacement(Instrux,Code,Instrux->Length,Size);
        }
        else {
          pTable._4_4_ = NdFetchModrm(Instrux,Code,Instrux->Length,Size);
        }
        if (0x7fffffff < pTable._4_4_) goto LAB_00160164;
      }
      Instrux->field_99 =
           *(anon_union_1_2_d70d35b6_for__INSTRUX_116 *)
            (Instrux->OpCodeBytes + (int)(((byte)(*(ulong *)&Instrux->field_0xc >> 0xc) & 0xf) - 1))
      ;
      if ((Instrux->Attributes & 0x800) == 0) {
        local_70 = (uint)((byte)((ulong)*(undefined8 *)&Instrux->field_0xc >> 0x28) & 0xf) +
                   (uint)((byte)(*(ulong *)&Instrux->field_0xc >> 0xc) & 0xf);
      }
      else {
        local_70 = (uint)Instrux->Length;
      }
      local_70 = local_70 - 1;
      *(ulong *)&Instrux->field_0xc =
           *(ulong *)&Instrux->field_0xc & 0xffff0fffffffffff |
           ((ulong)(local_70 & 0xff) & 0xf) << 0x2c;
    }
  }
LAB_00160164:
  *InsDef = _nextOpcode;
  return pTable._4_4_;
}

Assistant:

static NDSTATUS
NdFindInstruction(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_SIZET Size,
    ND_IDBE **InsDef
    )
{
    NDSTATUS status;
    const ND_TABLE *pTable;
    ND_IDBE *pIns;
    ND_BOOL stop, redf2, redf3;
    ND_UINT32 nextOpcode;

    // pre-init
    status = ND_STATUS_SUCCESS;
    pIns = (ND_IDBE *)ND_NULL;
    stop = ND_FALSE;
    nextOpcode = 0;
    redf2 = redf3 = ND_FALSE;

    switch (Instrux->EncMode)
    {
    case ND_ENCM_LEGACY:
        if (Instrux->Rex2.m0 == 1)
        {
            // Legacy map ID 1.
            pTable = (const ND_TABLE*)gLegacyMap_opcode.Table[0x0F];
        }
        else
        {
            // Legacy map ID 0.
            pTable = (const ND_TABLE*)&gLegacyMap_opcode;
        }
        break;
    case ND_ENCM_XOP:
        pTable = (const ND_TABLE *)gXopMap_mmmmm.Table[Instrux->Exs.m];
        break;
    case ND_ENCM_VEX:
        pTable = (const ND_TABLE *)gVexMap_mmmmm.Table[Instrux->Exs.m];
        break;
    case ND_ENCM_EVEX:
        pTable = (const ND_TABLE *)gEvexMap_mmmmm.Table[Instrux->Exs.m];
        break;
    default:
        pTable = (const ND_TABLE *)ND_NULL;
        break;
    }

    while ((!stop) && (ND_NULL != pTable))
    {
        switch (pTable->Type)
        {
        case ND_ILUT_INSTRUCTION:
            // We've found the leaf entry, which is an instruction - we can leave.
            pIns = (ND_IDBE *)(((ND_TABLE_INSTRUCTION *)pTable)->Instruction);
            stop = ND_TRUE;
            break;

        case ND_ILUT_OPCODE:
            // We need an opcode to keep going.
            status = NdFetchOpcode(Instrux, Code, Instrux->Length, Size);
            if (!ND_SUCCESS(status))
            {
                stop = ND_TRUE;
                break;
            }

            pTable = (const ND_TABLE *)pTable->Table[Instrux->OpCodeBytes[nextOpcode++]];
            break;

        case ND_ILUT_OPCODE_LAST:
            // We need an opcode to select the next table, but the opcode is AFTER the modrm/sib/displacement.
            if (!Instrux->HasModRm)
            {
                // Fetch modrm, SIB & displacement
                status = NdFetchModrmSibDisplacement(Instrux, Code, Instrux->Length, Size);
                if (!ND_SUCCESS(status))
                {
                    stop = ND_TRUE;
                    break;
                }
            }

            // Fetch the opcode, which is after the modrm and displacement.
            status = NdFetchOpcode(Instrux, Code, Instrux->Length, Size);
            if (!ND_SUCCESS(status))
            {
                stop = ND_TRUE;
                break;
            }

            pTable = (const ND_TABLE *)pTable->Table[Instrux->OpCodeBytes[nextOpcode++]];
            break;

        case ND_ILUT_MODRM_MOD:
            // We need modrm.mod to select the next table.
            if (!Instrux->HasModRm)
            {
                // Fetch modrm, SIB & displacement
                status = NdFetchModrmSibDisplacement(Instrux, Code, Instrux->Length, Size);
                if (!ND_SUCCESS(status))
                {
                    stop = ND_TRUE;
                    break;
                }
            }

            // Next index is either 0 (mem) or 1 (reg)
            pTable = (const ND_TABLE *)pTable->Table[Instrux->ModRm.mod == 3 ? 1 : 0];
            break;

        case ND_ILUT_MODRM_REG:
            // We need modrm.reg to select the next table.
            if (!Instrux->HasModRm)
            {
                // Fetch modrm, SIB & displacement
                status = NdFetchModrmSibDisplacement(Instrux, Code, Instrux->Length, Size);
                if (!ND_SUCCESS(status))
                {
                    stop = ND_TRUE;
                    break;
                }
            }

            // Next index is the reg.
            pTable = (const ND_TABLE *)pTable->Table[Instrux->ModRm.reg];
            break;

        case ND_ILUT_MODRM_RM:
            // We need modrm.rm to select the next table.
            if (!Instrux->HasModRm)
            {
                // Fetch modrm, SIB & displacement
                status = NdFetchModrmSibDisplacement(Instrux, Code, Instrux->Length, Size);
                if (!ND_SUCCESS(status))
                {
                    stop = ND_TRUE;
                    break;
                }
            }

            // Next index is the rm.
            pTable = (const ND_TABLE *)pTable->Table[Instrux->ModRm.rm];
            break;

        case ND_ILUT_MAN_PREFIX:
            // We have mandatory prefixes.
            if ((Instrux->Rep == 0xF2) && !redf2)
            {
                // We can only redirect once through one mandatory prefix, otherwise we may
                // enter an infinite loop (see CRC32 Gw Eb -> 0x66 0xF2 0x0F ...)
                redf2 = ND_TRUE;
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_MAN_PREF_F2];
                Instrux->HasMandatoryF2 = ND_TRUE;
            }
            else if ((Instrux->Rep == 0xF3) && !redf3)
            {
                redf3 = ND_TRUE;
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_MAN_PREF_F3];
                Instrux->HasMandatoryF3 = ND_TRUE;
            }
            else if (Instrux->HasOpSize)
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_MAN_PREF_66];
                Instrux->HasMandatory66 = ND_TRUE;
            }
            else
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_MAN_PREF_NP];
            }
            break;

        case ND_ILUT_MODE:
            if (ND_NULL != pTable->Table[Instrux->DefCode + 1])
            {
                pTable = (const ND_TABLE *)pTable->Table[Instrux->DefCode + 1];
            }
            else
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_MODE_NONE];
            }
            break;

        case ND_ILUT_DSIZE:
            // Handle default/forced redirections in 64 bit mode.
            if (ND_CODE_64 == Instrux->DefCode)
            {
                // 64-bit mode, we may have forced/default operand sizes.
                if ((ND_NULL != pTable->Table[4]) && (!Instrux->HasOpSize || Instrux->Exs.w))
                {
                    pTable = (const ND_TABLE *)pTable->Table[4];
                }
                else if (ND_NULL != pTable->Table[5])
                {
                    pTable = (const ND_TABLE *)pTable->Table[5];
                }
                else if (ND_NULL != pTable->Table[Instrux->OpMode + 1])
                {
                    pTable = (const ND_TABLE *)pTable->Table[Instrux->OpMode + 1];
                }
                else
                {
                    pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_DSIZE_NONE];
                }
            }
            else if (ND_NULL != pTable->Table[Instrux->OpMode + 1])
            {
                pTable = (const ND_TABLE *)pTable->Table[Instrux->OpMode + 1];
            }
            else
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_DSIZE_NONE];
            }
            break;

        case ND_ILUT_ASIZE:
            if (ND_NULL != pTable->Table[Instrux->AddrMode + 1])
            {
                pTable = (const ND_TABLE *)pTable->Table[Instrux->AddrMode + 1];
            }
            else
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_ASIZE_NONE];
            }
            break;

        case ND_ILUT_AUXILIARY:
            // Auxiliary redirection. Default to table[0] if nothing matches.
            if ((Instrux->Exs.b || Instrux->Exs.b4) && (ND_NULL != pTable->Table[ND_ILUT_INDEX_AUX_REXB]))
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_AUX_REXB];
            }
            else if (Instrux->Exs.w && (ND_NULL != pTable->Table[ND_ILUT_INDEX_AUX_REXW]))
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_AUX_REXW];
            }
            else if ((Instrux->DefCode == ND_CODE_64) && (ND_NULL != pTable->Table[ND_ILUT_INDEX_AUX_MO64]))
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_AUX_MO64];
            }
            else if (Instrux->Rep == ND_PREFIX_G1_REPE_REPZ && (ND_NULL != pTable->Table[ND_ILUT_INDEX_AUX_REPZ]))
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_AUX_REPZ];
            }
            else if ((Instrux->Rep != 0) && (ND_NULL != pTable->Table[ND_ILUT_INDEX_AUX_REP]))
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_AUX_REP];
            }
            else if (Instrux->DefCode == ND_CODE_64 && Instrux->HasModRm && 
                Instrux->ModRm.mod == 0 && Instrux->ModRm.rm == NDR_RBP && 
                ND_NULL != pTable->Table[ND_ILUT_INDEX_AUX_RIPREL])
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_AUX_RIPREL];
            }
            else if (Instrux->HasRex2 && (ND_NULL != pTable->Table[ND_ILUT_INDEX_AUX_REX2]))
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_AUX_REX2];
            }
            else if (Instrux->HasRex2 && Instrux->Rex2.w && (ND_NULL != pTable->Table[ND_ILUT_INDEX_AUX_REX2W]))
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_AUX_REX2W];
            }
            else
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_INDEX_AUX_NONE];
            }
            break;

        case ND_ILUT_VENDOR:
            // Vendor redirection. Go to the vendor specific entry.
            if (ND_NULL != pTable->Table[Instrux->VendMode])
            {
                pTable = (const ND_TABLE *)pTable->Table[Instrux->VendMode];
            }
            else
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_VEND_ANY];
            }
            break;

        case ND_ILUT_FEATURE:
            // Feature redirection. Normally NOP if feature is not set, but may be something else if feature is set.
            if ((ND_NULL != pTable->Table[ND_ILUT_FEATURE_MPX]) && !!(Instrux->FeatMode & ND_FEAT_MPX))
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_FEATURE_MPX];
            }
            else if ((ND_NULL != pTable->Table[ND_ILUT_FEATURE_CET]) && !!(Instrux->FeatMode & ND_FEAT_CET))
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_FEATURE_CET];
            }
            else if ((ND_NULL != pTable->Table[ND_ILUT_FEATURE_CLDEMOTE]) && !!(Instrux->FeatMode & ND_FEAT_CLDEMOTE))
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_FEATURE_CLDEMOTE];
            }
            else if ((ND_NULL != pTable->Table[ND_ILUT_FEATURE_PITI]) && !!(Instrux->FeatMode & ND_FEAT_PITI))
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_FEATURE_PITI];
            }
            else
            {
                pTable = (const ND_TABLE *)pTable->Table[ND_ILUT_FEATURE_NONE];
            }
            break;

        case ND_ILUT_EX_M:
            pTable = (const ND_TABLE *)pTable->Table[Instrux->Exs.m];
            break;

        case ND_ILUT_EX_PP:
            pTable = (const ND_TABLE *)pTable->Table[Instrux->Exs.p];
            break;

        case ND_ILUT_EX_L:
            if (Instrux->HasEvex && Instrux->Exs.m != 4 && Instrux->Exs.bm)
            {
                // We have evex; we need to fetch the modrm now, because we have to make sure we don't have SAE or ER;
                // if we do have SAE or ER, we have to check the modrm byte and see if it is a reg-reg form (mod = 3),
                // in which case L'L is forced to the maximum vector length of the instruction. We know for sure that
                // all EVEX instructions have modrm.
                // Skip these checks for EVEX map 4, which are legacy instructions promoted to EVEX, and which do not
                // support SAE, ER or broadcast.
                if (!Instrux->HasModRm)
                {
                    // Fetch modrm, SIB & displacement
                    status = NdFetchModrmSibDisplacement(Instrux, Code, Instrux->Length, Size);
                    if (!ND_SUCCESS(status))
                    {
                        stop = ND_TRUE;
                        break;
                    }
                }

                if (3 == Instrux->ModRm.mod)
                {
                    // We use the maximum vector length of the instruction. If the instruction does not support
                    // SAE or ER, a #UD would be generated. We check for this later.
                    if (ND_NULL != pTable->Table[2])
                    {
                        pTable = (const ND_TABLE *)pTable->Table[2];
                    }
                    else if (ND_NULL != pTable->Table[1])
                    {
                        pTable = (const ND_TABLE *)pTable->Table[1];
                    }
                    else
                    {
                        pTable = (const ND_TABLE *)pTable->Table[0];
                    }
                }
                else
                {
                    // Mod is mem, we simply use L'L for indexing, as no SAE or ER can be present.
                    pTable = (const ND_TABLE *)pTable->Table[Instrux->Exs.l];
                }
            }
            else
            {
                pTable = (const ND_TABLE *)pTable->Table[Instrux->Exs.l];
            }
            break;

        case ND_ILUT_EX_W:
            pTable = (const ND_TABLE *)pTable->Table[Instrux->Exs.w];
            break;

        case ND_ILUT_EX_WI:
            pTable = (const ND_TABLE *)pTable->Table[Instrux->DefCode == ND_CODE_64 ? Instrux->Exs.w : 0];
            break;

        case ND_ILUT_EX_ND:
            // New data modified field encoded in EVEX payload byte 3.
            pTable = (const ND_TABLE *)pTable->Table[Instrux->Exs.nd];
            break;

        case ND_ILUT_EX_NF:
            // No flags modifier field encoded in EVEX payload byte 3.
            pTable = (const ND_TABLE *)pTable->Table[Instrux->Exs.nf];
            break;

        case ND_ILUT_EX_SC:
            // Standard condition field encoded in EVEX payload byte 3.
            pTable = (const ND_TABLE *)pTable->Table[Instrux->Exs.sc];
            break;

        default:
            status = ND_STATUS_INTERNAL_ERROR;
            stop = ND_TRUE;
            break;
        }
    }

    // Error - leave now.
    if (!ND_SUCCESS(status))
    {
        goto cleanup_and_exit;
    }

    // No encoding found - leave now.
    if (ND_NULL == pIns)
    {
        status = ND_STATUS_INVALID_ENCODING;
        goto cleanup_and_exit;
    }

    // Bingo! Valid instruction found for the encoding. If Modrm is needed and we didn't fetch it - do it now.
    if ((pIns->Attributes & ND_FLAG_MODRM) && (!Instrux->HasModRm))
    {
        if (0 == (pIns->Attributes & ND_FLAG_MFR))
        {
            // Fetch Mod R/M, SIB & displacement.
            status = NdFetchModrmSibDisplacement(Instrux, Code, Instrux->Length, Size);
            if (!ND_SUCCESS(status))
            {
                goto cleanup_and_exit;
            }
        }
        else
        {
            // Handle special MOV with control and debug registers - the mod is always forced to register. SIB
            // and displacement is ignored.
            status = NdFetchModrm(Instrux, Code, Instrux->Length, Size);
            if (!ND_SUCCESS(status))
            {
                goto cleanup_and_exit;
            }
        }
    }

    // Store primary opcode.
    Instrux->PrimaryOpCode = Instrux->OpCodeBytes[Instrux->OpLength - 1];

    Instrux->MainOpOffset = ND_IS_3DNOW(Instrux) ? Instrux->Length - 1 : Instrux->OpOffset + Instrux->OpLength - 1;

cleanup_and_exit:
    *InsDef = pIns;

    return status;
}